

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
KDIS::DATA_TYPE::VariableDatum::GetDatumValueAsKFLOAT64
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,VariableDatum *this)

{
  pointer pDVar1;
  pointer pDVar2;
  iterator __position;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [15];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  char cVar20;
  KUINT16 i;
  double in_RAX;
  long lVar21;
  int iVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double local_38;
  ulong uVar27;
  
  local_38 = in_RAX;
  if (UTILS::IsMachineBigEndian()::conv == '\0') {
    GetDatumValueAsKFLOAT64();
  }
  cVar20 = UTILS::IsMachineBigEndian()::conv;
  pDVar1 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar23 = ceil((double)this->m_ui32DatumLength * 0.125);
  if ((pDVar1 != pDVar2) && (7 < (uint)(long)dVar23)) {
    iVar22 = 0;
    do {
      lVar21 = 0;
      do {
        *(KOCTET *)((long)&local_38 + lVar21) = pDVar1->Buffer[lVar21];
        lVar21 = lVar21 + 1;
      } while (lVar21 != 8);
      if (cVar20 == '\x01') {
        auVar12._8_6_ = 0;
        auVar12._0_8_ = local_38;
        auVar12[0xe] = (char)((ulong)local_38 >> 0x38);
        auVar15._8_4_ = 0;
        auVar15._0_8_ = local_38;
        auVar15[0xc] = (char)((ulong)local_38 >> 0x30);
        auVar15._13_2_ = auVar12._13_2_;
        auVar16._8_4_ = 0;
        auVar16._0_8_ = local_38;
        auVar16._12_3_ = auVar15._12_3_;
        auVar17._8_2_ = 0;
        auVar17._0_8_ = local_38;
        auVar17[10] = (char)((ulong)local_38 >> 0x28);
        auVar17._11_4_ = auVar16._11_4_;
        auVar18._8_2_ = 0;
        auVar18._0_8_ = local_38;
        auVar18._10_5_ = auVar17._10_5_;
        auVar19[8] = (char)((ulong)local_38 >> 0x20);
        auVar19._0_8_ = local_38;
        auVar19._9_6_ = auVar18._9_6_;
        uVar27 = CONCAT17(0,auVar19._8_7_);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar27;
        auVar13._1_9_ = SUB169(auVar14 << 0x40,7);
        auVar13[0] = (char)((ulong)local_38 >> 0x18);
        auVar13._10_6_ = 0;
        auVar11._1_11_ = SUB1611(auVar13 << 0x30,5);
        auVar11[0] = (char)((ulong)local_38 >> 0x10);
        auVar26._12_4_ = 0;
        auVar26._0_12_ = auVar11;
        auVar24._3_13_ = SUB1613(auVar26 << 0x20,3);
        auVar24[2] = (char)((ulong)local_38 >> 8);
        auVar24[0] = SUB81(local_38,0);
        auVar24[1] = 0;
        auVar25._8_4_ = auVar24._0_4_;
        auVar25._0_8_ = uVar27;
        auVar25._12_4_ = auVar11._0_4_;
        auVar26 = pshuflw(auVar25,auVar25,0x1b);
        auVar26 = pshufhw(auVar26,auVar26,0x1b);
        sVar3 = auVar26._0_2_;
        sVar4 = auVar26._2_2_;
        sVar5 = auVar26._4_2_;
        sVar6 = auVar26._6_2_;
        sVar7 = auVar26._8_2_;
        sVar8 = auVar26._10_2_;
        sVar9 = auVar26._12_2_;
        sVar10 = auVar26._14_2_;
        local_38 = (double)CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar26[0xe] - (0xff < sVar10)
                                    ,CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar26[0xc] -
                                              (0xff < sVar9),
                                              CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar26[10] -
                                                       (0xff < sVar8),
                                                       CONCAT14((0 < sVar7) * (sVar7 < 0x100) *
                                                                auVar26[8] - (0xff < sVar7),
                                                                CONCAT13((0 < sVar6) *
                                                                         (sVar6 < 0x100) *
                                                                         auVar26[6] - (0xff < sVar6)
                                                                         ,CONCAT12((0 < sVar5) *
                                                                                   (sVar5 < 0x100) *
                                                                                   auVar26[4] -
                                                                                   (0xff < sVar5),
                                                                                   CONCAT11((0 < 
                                                  sVar4) * (sVar4 < 0x100) * auVar26[2] -
                                                  (0xff < sVar4),
                                                  (0 < sVar3) * (sVar3 < 0x100) * auVar26[0] -
                                                  (0xff < sVar3))))))));
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (__return_storage_ptr__,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar22 = iVar22 + 8;
    } while (7 < (uint)(long)dVar23 - iVar22);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<KFLOAT64> VariableDatum::GetDatumValueAsKFLOAT64() const
{
    KBOOL bSwapBytes = !IsMachineBigEndian();

    vector<DatumEntry>::const_iterator citr = m_v8DatumValue.begin();
    vector<DatumEntry>::const_iterator citrEnd = m_v8DatumValue.end();

    vector<KFLOAT64> m_Return;

    KUINT32 ui32CurrentPos = 0;
    KUINT32 ui32LengthInOctets = ceil(m_ui32DatumLength / 8.0);

    while( citr != citrEnd )
    {
        if( ( ui32LengthInOctets - ui32CurrentPos ) < 8 )break;

        m_Return.push_back( NetToKFLOAT64( citr->Buffer, bSwapBytes ).m_Value );

        ui32CurrentPos += 8;
    }

    return m_Return;
}